

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::setRobotState
          (KinDynComputations *this,MatrixView<const_double> *world_T_base,Span<const_double,__1L> s
          ,Span<const_double,__1L> base_velocity,Span<const_double,__1L> s_dot,
          Span<const_double,__1L> world_gravity)

{
  bool bVar1;
  char *pcVar2;
  Vector3 local_228;
  VectorDynSize local_210 [32];
  VectorDynSize local_1f0 [32];
  SpatialVector<iDynTree::SpatialMotionVector> local_1d0;
  SpatialMotionVector local_1a0;
  Twist local_170 [48];
  MatrixView<const_double> local_140;
  Transform local_110 [96];
  MatrixFixSize local_b0 [128];
  
  local_140.m_rows = world_T_base->m_rows;
  if ((local_140.m_rows == 4) && (local_140.m_cols = world_T_base->m_cols, local_140.m_cols == 4)) {
    if (base_velocity.storage_.super_extent_type<_1L>.size_.size_ == 6) {
      local_140.m_storage = world_T_base->m_storage;
      local_140.m_storageOrder = world_T_base->m_storageOrder;
      local_140.m_innerStride = world_T_base->m_innerStride;
      local_140.m_outerStride = world_T_base->m_outerStride;
      MatrixFixSize<4U,_4U>::MatrixFixSize((MatrixFixSize<4U,_4U> *)local_b0,&local_140);
      iDynTree::Transform::Transform(local_110,local_b0);
      iDynTree::VectorDynSize::VectorDynSize
                (local_1f0,s.storage_.super_extent_type<_1L>.size_.size_,s.storage_.data_);
      SpatialVector<iDynTree::SpatialMotionVector>::SpatialVector(&local_1d0,base_velocity);
      iDynTree::SpatialMotionVector::SpatialMotionVector(&local_1a0,(SpatialVector *)&local_1d0);
      iDynTree::Twist::Twist(local_170,&local_1a0);
      iDynTree::VectorDynSize::VectorDynSize
                (local_210,s_dot.storage_.super_extent_type<_1L>.size_,s_dot.storage_.data_);
      if (world_gravity.storage_.super_extent_type<_1L>.size_ == 3) {
        local_228.m_data[2] = world_gravity.storage_.data_[2];
        local_228.m_data[0] = *world_gravity.storage_.data_;
        local_228.m_data[1] = world_gravity.storage_.data_[1];
      }
      else {
        iDynTree::reportError
                  ("VectorFixSize","constructor",
                   "input vector does not have the right number of elements");
        local_228.m_data[0] = 0.0;
        local_228.m_data[1] = 0.0;
        local_228.m_data[2] = 0.0;
      }
      bVar1 = setRobotState(this,local_110,local_1f0,local_170,local_210,&local_228);
      iDynTree::VectorDynSize::~VectorDynSize(local_210);
      iDynTree::VectorDynSize::~VectorDynSize(local_1f0);
      return bVar1;
    }
    pcVar2 = "Wrong size in input base_velocity";
  }
  else {
    pcVar2 = "Wrong size in input world_T_base";
  }
  iDynTree::reportError("KinDynComputations","setRobotState",pcVar2);
  return false;
}

Assistant:

bool KinDynComputations::setRobotState(iDynTree::MatrixView<const double> world_T_base,
                                       Span<const double> s,
                                       Span<const double> base_velocity,
                                       Span<const double> s_dot,
                                       Span<const double> world_gravity)

{

    constexpr int expected_transform_cols = 4;
    constexpr int expected_transform_rows = 4;
    bool ok = (world_T_base.rows() == expected_transform_rows) && (world_T_base.cols() == expected_transform_cols);
    if( !ok )
    {
        reportError("KinDynComputations","setRobotState","Wrong size in input world_T_base");
        return false;
    }

    constexpr int expected_twist_size = 6;
    ok = base_velocity.size() == expected_twist_size;
    if( !ok )
    {
        reportError("KinDynComputations","setRobotState","Wrong size in input base_velocity");
        return false;
    }


    return this->setRobotState(iDynTree::Transform(world_T_base),
                               s,
                               iDynTree::SpatialMotionVector(base_velocity),
                               s_dot,
                               world_gravity);
}